

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNObjProp::gen_code_inline_obj(CTPNObjProp *this)

{
  int iVar1;
  size_t in_RDI;
  char *unaff_retaddr;
  CTPNDstr *dstr;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  CTcCodeStream *pCVar2;
  CTcDataStream *in_stack_ffffffffffffffe0;
  CTPNObjProp *in_stack_fffffffffffffff0;
  CTPNDstrBase *this_00;
  size_t len;
  
  len = in_RDI;
  CTcTokenizer::set_line_info(G_tok,*(CTcTokFileDesc **)(in_RDI + 0x10),*(long *)(in_RDI + 0x18));
  if (*(long *)(in_RDI + 0x50) == 0) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      iVar1 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x38))();
      if (iVar1 == 0) {
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcGenTarg::note_push((CTcGenTarg *)0x2e0241);
        (**(code **)**(undefined8 **)(in_RDI + 0x38))(*(undefined8 **)(in_RDI + 0x38),0);
        iVar1 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x50))();
        if (iVar1 == 0) {
          CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
          CTcGenTarg::note_push((CTcGenTarg *)0x2e028a);
        }
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        pCVar2 = G_cs;
        CTcSymPropBase::get_prop(*(CTcSymPropBase **)(in_RDI + 0x28));
        CTcDataStream::write_prop_id(in_stack_ffffffffffffffe0,(uint)((ulong)pCVar2 >> 0x20));
        CTcGenTarg::note_pop(G_cg,2);
      }
      else {
        this_00 = *(CTPNDstrBase **)(in_RDI + 0x38);
        CTPNDstrBase::get_str(this_00);
        CTPNDstrBase::get_str_len(this_00);
        CTPNConst::s_gen_code_str(unaff_retaddr,len);
        gen_setMethod((CTPNObjProp *)this_00);
      }
    }
  }
  else {
    (**(code **)**(undefined8 **)(in_RDI + 0x50))(*(undefined8 **)(in_RDI + 0x50),0);
    gen_setMethod(in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void CTPNObjProp::gen_code_inline_obj()
{
    /* set the current source location for error reporting */
    G_tok->set_line_info(file_, linenum_);

    /* generate code for our expression or our code body, as appropriate */
    if (inline_method_ != 0)
    {
        /* 
         *   Code as an in-line method.  This means that the code was
         *   specified as an explicit method in braces; we compile it as an
         *   anonymous method so that it can access locals in enclosing
         *   scopes.  Generate the code to construct the closure object, then
         *   call obj.setMethod(prop, anonMethod) to bind it as a method of
         *   the object.  This will make it act like a regular method, in
         *   that evaluating the property will call the method.
         */
        inline_method_->gen_code(FALSE, FALSE);

        /* generate the setMethod */
        gen_setMethod();
    }
    else if (expr_ != 0)
    {
        /* check the type of expression */
        if (expr_->is_dstring())
        {
            /* 
             *   Double-quoted string - generate obj.setMethod(prop, string)
             */
            
            /* push the string contents as a regular sstring constant */
            CTPNDstr *dstr = (CTPNDstr *)expr_;
            CTPNConst::s_gen_code_str(dstr->get_str(), dstr->get_str_len());
            
            /* get the setMethod property */
            gen_setMethod();
        }
        else
        {
            /*
             *   Expression, constant or live.  Generate the code to evaluate
             *   the expression; this runs at the moment of evaluating the
             *   overall inline object expression, so we caputre the value of
             *   the expression at the time we create the inline object
             *   instance (and fix the value at that point - this isn't a
             *   method that's invoked when the property is evaluated).
             */
            
            /* push the new object referene */
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();

            /* it's a constant value - do a setprop; start with my value */
            expr_->gen_code(FALSE, FALSE);

            /* if it doesn't have a return value, set the property to nil */
            if (!expr_->has_return_value())
            {
                G_cg->write_op(OPC_PUSHNIL);
                G_cg->note_push();
            }

            /* get the object and value into the proper order */
            G_cg->write_op(OPC_SWAP);

            /* generate the setprop for <obj>.<prop> = <value> */
            G_cg->write_op(OPC_SETPROP);
            G_cs->write_prop_id(prop_sym_->get_prop());
            G_cg->note_pop(2);
        }
    }
}